

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void __thiscall Helper::GenerateShuffleVectors(Helper *this,int n_p,int n_d,int count)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  int iVar2;
  time_t tVar3;
  reference pvVar4;
  ostream *poVar5;
  int local_434;
  string *local_420;
  int local_390;
  int local_38c;
  int k;
  int j;
  int l;
  int m;
  int n;
  int i;
  time_t t;
  allocator local_368;
  allocator local_367;
  allocator local_366;
  allocator local_365 [20];
  allocator local_351;
  string *local_350;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  iterator local_248;
  size_type local_240;
  undefined1 local_238 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  ofstream output_file;
  int count_local;
  int n_d_local;
  int n_p_local;
  Helper *this_local;
  
  std::ofstream::ofstream
            (&file_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  t._4_1_ = 1;
  local_350 = local_348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"../randoms/alice/U_PA.txt",&local_351);
  local_350 = local_328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"../randoms/bob/U_PB.txt",local_365);
  local_350 = local_308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"../randoms/alice/R_PA.txt",&local_366);
  local_350 = local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"../randoms/bob/R_PB.txt",&local_367);
  local_350 = local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"../randoms/alice/U_DA.txt",&local_368);
  local_350 = local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"../randoms/bob/U_DB.txt",(allocator *)((long)&t + 7));
  local_350 = local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"../randoms/alice/R_DA.txt",(allocator *)((long)&t + 6));
  local_350 = local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"../randoms/bob/R_DB.txt",(allocator *)((long)&t + 5));
  t._4_1_ = 0;
  local_248 = (iterator)local_348;
  local_240 = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&t + 3));
  __l._M_len = local_240;
  __l._M_array = local_248;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_238,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&t + 3));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&t + 3));
  local_420 = (string *)&local_248;
  do {
    local_420 = local_420 + -0x20;
    std::__cxx11::string::~string(local_420);
  } while (local_420 != local_348);
  std::allocator<char>::~allocator((allocator<char> *)((long)&t + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&t + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&t + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_367);
  std::allocator<char>::~allocator((allocator<char> *)&local_366);
  std::allocator<char>::~allocator((allocator<char> *)local_365);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  tVar3 = time((time_t *)&n);
  srand((uint)tVar3);
  for (m = 0; m < 8; m = m + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_238,(long)m);
    std::ofstream::open(&file_name.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4,0x10);
    local_434 = n_d;
    if (m < 4) {
      local_434 = n_p;
    }
    iVar1 = 2;
    k = count;
    if (m < 4) {
      iVar1 = 5;
    }
    while (k != 0) {
      for (local_38c = 0; local_38c < local_434; local_38c = local_38c + 1) {
        for (local_390 = 0; local_390 < iVar1; local_390 = local_390 + 1) {
          iVar2 = rand();
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)
                              &file_name.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar2 % 10000);
          std::operator<<(poVar5," ");
        }
        std::ostream::operator<<
                  ((ostream *)
                   &file_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<
                ((ostream *)
                 &file_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 std::endl<char,std::char_traits<char>>);
      k = k + -1;
    }
    std::ostream::flush();
    std::ofstream::close();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238);
  std::ofstream::~ofstream
            (&file_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Helper::GenerateShuffleVectors(int n_p, int n_d, int count)
{
    std::ofstream output_file;
    std::vector<std::string> file_name = {"../randoms/alice/U_PA.txt", "../randoms/bob/U_PB.txt", "../randoms/alice/R_PA.txt", "../randoms/bob/R_PB.txt",
                                          "../randoms/alice/U_DA.txt", "../randoms/bob/U_DB.txt", "../randoms/alice/R_DA.txt", "../randoms/bob/R_DB.txt"};
    time_t t;
    srand((unsigned)time(&t));

    for (int i = 0; i < 8; i++)
    {
        output_file.open(file_name[i]);
        int n = (i < 4 ? n_p : n_d);
        int m = (i < 4 ? 5 : 2);
        int l = count;
        while (l--)
        {
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                    output_file << rand() %10000 << " ";
                output_file << std::endl;
            }
            output_file << std::endl;
        }
        output_file.flush();
        output_file.close();
    }
}